

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

void __thiscall HttpResponse::parseHttpEnvelope(HttpResponse *this)

{
  StringBufferHelper *pSVar1;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pSVar1 = this->_pRawBuffer;
  std::__cxx11::string::string((string *)&local_30," ",&local_91);
  StringBufferHelper::GetNextSegmentBySeparator(&local_90,pSVar1,&local_30);
  std::__cxx11::string::operator=((string *)&this->_httpVersion,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  pSVar1 = this->_pRawBuffer;
  std::__cxx11::string::string((string *)&local_50," ",&local_91);
  StringBufferHelper::GetNextSegmentBySeparator(&local_90,pSVar1,&local_50);
  std::__cxx11::string::operator=((string *)&this->_httpStatusCode,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  pSVar1 = this->_pRawBuffer;
  std::__cxx11::string::string((string *)&local_70,"\n",&local_91);
  StringBufferHelper::GetNextSegmentBySeparator(&local_90,pSVar1,&local_70);
  std::__cxx11::string::operator=((string *)&this->_httpStatusText,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void HttpResponse::parseHttpEnvelope() {
  _httpVersion = _pRawBuffer->GetNextSegmentBySeparator(" ");
  _httpStatusCode = _pRawBuffer->GetNextSegmentBySeparator(" ");
  _httpStatusText = _pRawBuffer->GetNextSegmentBySeparator("\n");
}